

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::FormatStrSS<std::__cxx11::stringstream,unsigned_int>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               MemorySizeFormatter<unsigned_int> *Arg)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar6;
  
  uVar1 = Arg->size;
  uVar4 = uVar1;
  if (Arg->ref_size != 0) {
    uVar4 = Arg->ref_size;
  }
  if (uVar4 < 0x40000000) {
    if (uVar4 < 0x100000) {
      if (uVar4 < 0x400) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
        pcVar6 = " Byte";
        if ((Arg->size & 1) == 0) {
          pcVar6 = " Bytes";
        }
      }
      else {
        lVar2 = *(long *)(ss + 0x10);
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(ss + lVar3 + 0x28) = *(uint *)(ss + lVar3 + 0x28) & 0xfffffefb | 4;
        *(long *)(ss + *(long *)(lVar2 + -0x18) + 0x18) = (long)Arg->precision;
        poVar5 = std::ostream::_M_insert<double>((double)uVar1 * 0.0009765625);
        pcVar6 = " KB";
      }
    }
    else {
      lVar2 = *(long *)(ss + 0x10);
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(ss + lVar3 + 0x28) = *(uint *)(ss + lVar3 + 0x28) & 0xfffffefb | 4;
      *(long *)(ss + *(long *)(lVar2 + -0x18) + 0x18) = (long)Arg->precision;
      poVar5 = std::ostream::_M_insert<double>((double)uVar1 * 9.5367431640625e-07);
      pcVar6 = " MB";
    }
  }
  else {
    lVar2 = *(long *)(ss + 0x10);
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(ss + lVar3 + 0x28) = *(uint *)(ss + lVar3 + 0x28) & 0xfffffefb | 4;
    *(long *)(ss + *(long *)(lVar2 + -0x18) + 0x18) = (long)Arg->precision;
    poVar5 = std::ostream::_M_insert<double>((double)uVar1 * 9.313225746154785e-10);
    pcVar6 = " GB";
  }
  std::operator<<(poVar5,pcVar6);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const MemorySizeFormatter<Type>& Arg)
{
    auto ref_size = Arg.ref_size != 0 ? Arg.ref_size : Arg.size;
    if (ref_size >= (1 << 30))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 30} << " GB";
    }
    else if (ref_size >= (1 << 20))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 20} << " MB";
    }
    else if (ref_size >= (1 << 10))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 10} << " KB";
    }
    else
    {
        ss << Arg.size << (((Arg.size & 0x01) == 0x01) ? " Byte" : " Bytes");
    }
}